

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  parasail_result_t *ppVar13;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  char *pcVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  char *__format;
  int16_t iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  undefined8 unaff_R13;
  long lVar30;
  bool bVar31;
  short sVar32;
  undefined4 uVar33;
  short sVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  short sVar39;
  short sVar40;
  undefined1 auVar41 [16];
  short sVar42;
  __m128i alVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i alVar47;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  undefined1 auVar48 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar57;
  ulong uVar58;
  short sVar61;
  short sVar62;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar59 [16];
  short sVar63;
  short sVar67;
  undefined1 auVar60 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ushort uVar73;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar74 [16];
  ushort uVar81;
  uint local_d4;
  int local_d0;
  __m128i_16_t e;
  __m128i_16_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "open";
        }
        else {
          if (-1 < gap) {
            uVar12 = uVar3 - 1;
            uVar28 = (ulong)uVar3 + 7 >> 3;
            iVar21 = -open;
            iVar17 = ppVar5->min;
            iVar14 = -iVar17;
            if (iVar17 != iVar21 && SBORROW4(iVar17,iVar21) == iVar17 + open < 0) {
              iVar14 = open;
            }
            iVar17 = ppVar5->max;
            ppVar13 = parasail_result_new_rowcol1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (ppVar13 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            ppVar13->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x8240402;
            ptr = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar28);
            ptr_02 = parasail_memalign___m128i(0x10,uVar28);
            ptr_03 = parasail_memalign___m128i(0x10,uVar28);
            if (ptr_03 == (__m128i *)0x0 ||
                ((ptr_02 == (__m128i *)0x0 || ptr_01 == (__m128i *)0x0) ||
                (ptr_00 == (int16_t *)0x0 || ptr == (__m128i *)0x0))) {
              return (parasail_result_t *)0x0;
            }
            iVar15 = s2Len + -1;
            uVar20 = 7 - (int)(uVar12 / uVar28);
            auVar34 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar33 = auVar34._0_4_;
            auVar46._4_4_ = uVar33;
            auVar46._0_4_ = uVar33;
            auVar46._8_4_ = uVar33;
            auVar46._12_4_ = uVar33;
            auVar34 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar33 = auVar34._0_4_;
            local_d4 = iVar14 - 0x7fff;
            auVar35 = pshuflw(ZEXT416(local_d4),ZEXT416(local_d4),0);
            auVar36._0_4_ = auVar35._0_4_;
            auVar36._4_4_ = auVar36._0_4_;
            auVar36._8_4_ = auVar36._0_4_;
            auVar36._12_4_ = auVar36._0_4_;
            auVar34 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R13 >> 0x10),0x7ffe - (short)iVar17
                                            ));
            auVar38 = pshuflw(auVar34,auVar34,0);
            auVar34._0_4_ = auVar38._0_4_;
            auVar34._4_4_ = auVar34._0_4_;
            auVar34._8_4_ = auVar34._0_4_;
            auVar34._12_4_ = auVar34._0_4_;
            auVar41 = pshuflw(ZEXT416(uVar20),ZEXT416(uVar20),0);
            sVar32 = auVar41._0_2_;
            sVar37 = auVar41._2_2_;
            uVar16 = (uint)uVar28;
            auVar41 = pshufb(ZEXT416(-(uVar16 * gap)),_DAT_008a3bd0);
            auVar41 = paddsw(auVar41,ZEXT416(local_d4 & 0xffff));
            lVar24 = (long)iVar21;
            for (uVar27 = 0; uVar27 != uVar28; uVar27 = uVar27 + 1) {
              lVar29 = lVar24;
              for (lVar25 = 0; lVar25 != 8; lVar25 = lVar25 + 1) {
                lVar26 = lVar29;
                if (s1_beg != 0) {
                  lVar26 = 0;
                }
                lVar30 = -0x8000;
                if (-0x8000 < lVar26) {
                  lVar30 = lVar26;
                }
                lVar26 = lVar26 - (ulong)(uint)open;
                if (lVar26 < -0x7fff) {
                  lVar26 = -0x8000;
                }
                *(short *)((long)&h + lVar25 * 2) = (short)lVar30;
                *(short *)((long)&e + lVar25 * 2) = (short)lVar26;
                lVar29 = lVar29 - uVar28 * (uint)gap;
              }
              ptr_02[uVar27][0] = h.m[0];
              ptr_02[uVar27][1] = h.m[1];
              ptr[uVar27][0] = e.m[0];
              ptr[uVar27][1] = e.m[1];
              lVar24 = lVar24 - (ulong)(uint)gap;
            }
            *ptr_00 = 0;
            for (uVar27 = 1; s2Len + 1 != uVar27; uVar27 = uVar27 + 1) {
              iVar23 = -0x8000;
              if (-0x8000 < iVar21) {
                iVar23 = (int16_t)iVar21;
              }
              if (s2_beg != 0) {
                iVar23 = 0;
              }
              ptr_00[uVar27] = iVar23;
              iVar21 = iVar21 - gap;
            }
            alVar43 = (__m128i)psubsw((undefined1  [16])0x0,auVar46);
            for (uVar22 = uVar16 - 1; -1 < (int)uVar22; uVar22 = uVar22 - 1) {
              ptr_03[uVar22] = alVar43;
              auVar44._4_4_ = uVar33;
              auVar44._0_4_ = uVar33;
              auVar44._8_4_ = uVar33;
              auVar44._12_4_ = uVar33;
              alVar43 = (__m128i)psubsw((undefined1  [16])alVar43,auVar44);
              sVar40 = (short)alVar43[0];
              sVar39 = auVar34._0_2_;
              auVar69._0_2_ =
                   (ushort)(sVar40 < sVar39) * sVar40 | (ushort)(sVar40 >= sVar39) * sVar39;
              sVar40 = alVar43[0]._2_2_;
              sVar39 = auVar34._2_2_;
              auVar69._2_2_ =
                   (ushort)(sVar40 < sVar39) * sVar40 | (ushort)(sVar40 >= sVar39) * sVar39;
              sVar40 = alVar43[0]._4_2_;
              sVar39 = auVar34._4_2_;
              auVar69._4_2_ =
                   (ushort)(sVar40 < sVar39) * sVar40 | (ushort)(sVar40 >= sVar39) * sVar39;
              sVar40 = alVar43[0]._6_2_;
              sVar39 = auVar34._6_2_;
              auVar69._6_2_ =
                   (ushort)(sVar40 < sVar39) * sVar40 | (ushort)(sVar40 >= sVar39) * sVar39;
              sVar40 = (short)alVar43[1];
              sVar39 = auVar34._8_2_;
              auVar69._8_2_ =
                   (ushort)(sVar40 < sVar39) * sVar40 | (ushort)(sVar40 >= sVar39) * sVar39;
              sVar40 = alVar43[1]._2_2_;
              sVar39 = auVar34._10_2_;
              auVar69._10_2_ =
                   (ushort)(sVar40 < sVar39) * sVar40 | (ushort)(sVar40 >= sVar39) * sVar39;
              sVar40 = alVar43[1]._4_2_;
              sVar39 = auVar34._12_2_;
              sVar42 = auVar34._14_2_;
              auVar69._12_2_ =
                   (ushort)(sVar40 < sVar39) * sVar40 | (ushort)(sVar40 >= sVar39) * sVar39;
              sVar40 = alVar43[1]._6_2_;
              auVar69._14_2_ =
                   (ushort)(sVar40 < sVar42) * sVar40 | (ushort)(sVar40 >= sVar42) * sVar42;
              auVar34 = auVar69;
            }
            lVar24 = uVar28 * 0x10;
            uVar27 = 0;
            auVar44 = auVar36;
            auVar48 = auVar36;
            local_d0 = iVar15;
            while (uVar27 != (uint)s2Len) {
              uVar58 = ptr_02[uVar16 - 1][0];
              auVar55._8_8_ = ptr_02[uVar16 - 1][1] << 0x10 | uVar58 >> 0x30;
              auVar55._0_8_ = uVar58 << 0x10 | (ulong)(ushort)ptr_00[uVar27];
              iVar17 = ppVar5->mapper[(byte)s2[uVar27]];
              auVar54 = psubsw(auVar36,(undefined1  [16])*ptr_03);
              lVar29 = 0;
              auVar72 = auVar36;
              while( true ) {
                sVar40 = auVar72._0_2_;
                sVar39 = auVar72._2_2_;
                sVar42 = auVar72._4_2_;
                sVar49 = auVar72._6_2_;
                sVar50 = auVar72._8_2_;
                sVar51 = auVar72._10_2_;
                sVar52 = auVar72._12_2_;
                sVar53 = auVar72._14_2_;
                if (lVar24 == lVar29) break;
                auVar69 = *(undefined1 (*) [16])((long)*ptr_02 + lVar29);
                auVar7._4_4_ = uVar33;
                auVar7._0_4_ = uVar33;
                auVar7._8_4_ = uVar33;
                auVar7._12_4_ = uVar33;
                auVar72 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar29),auVar7);
                auVar74 = psubsw(auVar69,auVar46);
                auVar68 = paddsw(auVar55,*(undefined1 (*) [16])
                                          ((long)pvVar4 +
                                          lVar29 + (long)(int)(iVar17 * uVar16) * 0x10));
                auVar55 = paddsw(auVar54,*(undefined1 (*) [16])((long)*ptr_03 + lVar29));
                sVar57 = auVar72._0_2_;
                sVar61 = auVar74._0_2_;
                uVar73 = (ushort)(sVar61 < sVar57) * sVar57 | (ushort)(sVar61 >= sVar57) * sVar61;
                sVar57 = auVar72._2_2_;
                sVar61 = auVar74._2_2_;
                uVar75 = (ushort)(sVar61 < sVar57) * sVar57 | (ushort)(sVar61 >= sVar57) * sVar61;
                sVar57 = auVar72._4_2_;
                sVar61 = auVar74._4_2_;
                uVar76 = (ushort)(sVar61 < sVar57) * sVar57 | (ushort)(sVar61 >= sVar57) * sVar61;
                sVar57 = auVar72._6_2_;
                sVar61 = auVar74._6_2_;
                uVar77 = (ushort)(sVar61 < sVar57) * sVar57 | (ushort)(sVar61 >= sVar57) * sVar61;
                sVar57 = auVar72._8_2_;
                sVar61 = auVar74._8_2_;
                uVar78 = (ushort)(sVar61 < sVar57) * sVar57 | (ushort)(sVar61 >= sVar57) * sVar61;
                sVar57 = auVar72._10_2_;
                sVar61 = auVar74._10_2_;
                uVar79 = (ushort)(sVar61 < sVar57) * sVar57 | (ushort)(sVar61 >= sVar57) * sVar61;
                sVar57 = auVar72._12_2_;
                sVar61 = auVar74._12_2_;
                sVar62 = auVar74._14_2_;
                uVar80 = (ushort)(sVar61 < sVar57) * sVar57 | (ushort)(sVar61 >= sVar57) * sVar61;
                sVar57 = auVar72._14_2_;
                uVar81 = (ushort)(sVar62 < sVar57) * sVar57 | (ushort)(sVar62 >= sVar57) * sVar62;
                sVar57 = auVar55._0_2_;
                auVar72._0_2_ =
                     (ushort)(sVar40 < sVar57) * sVar57 | (ushort)(sVar40 >= sVar57) * sVar40;
                sVar40 = auVar55._2_2_;
                auVar72._2_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar55._4_2_;
                auVar72._4_2_ =
                     (ushort)(sVar42 < sVar40) * sVar40 | (ushort)(sVar42 >= sVar40) * sVar42;
                sVar40 = auVar55._6_2_;
                auVar72._6_2_ =
                     (ushort)(sVar49 < sVar40) * sVar40 | (ushort)(sVar49 >= sVar40) * sVar49;
                sVar40 = auVar55._8_2_;
                auVar72._8_2_ =
                     (ushort)(sVar50 < sVar40) * sVar40 | (ushort)(sVar50 >= sVar40) * sVar50;
                sVar40 = auVar55._10_2_;
                auVar72._10_2_ =
                     (ushort)(sVar51 < sVar40) * sVar40 | (ushort)(sVar51 >= sVar40) * sVar51;
                sVar40 = auVar55._12_2_;
                auVar72._12_2_ =
                     (ushort)(sVar52 < sVar40) * sVar40 | (ushort)(sVar52 >= sVar40) * sVar52;
                sVar40 = auVar55._14_2_;
                auVar72._14_2_ =
                     (ushort)(sVar53 < sVar40) * sVar40 | (ushort)(sVar53 >= sVar40) * sVar53;
                sVar40 = auVar68._0_2_;
                auVar54._0_2_ =
                     (sVar40 < (short)uVar73) * uVar73 | (ushort)(sVar40 >= (short)uVar73) * sVar40;
                sVar40 = auVar68._2_2_;
                auVar54._2_2_ =
                     (sVar40 < (short)uVar75) * uVar75 | (ushort)(sVar40 >= (short)uVar75) * sVar40;
                sVar40 = auVar68._4_2_;
                auVar54._4_2_ =
                     (sVar40 < (short)uVar76) * uVar76 | (ushort)(sVar40 >= (short)uVar76) * sVar40;
                sVar40 = auVar68._6_2_;
                auVar54._6_2_ =
                     (sVar40 < (short)uVar77) * uVar77 | (ushort)(sVar40 >= (short)uVar77) * sVar40;
                sVar40 = auVar68._8_2_;
                auVar54._8_2_ =
                     (sVar40 < (short)uVar78) * uVar78 | (ushort)(sVar40 >= (short)uVar78) * sVar40;
                sVar40 = auVar68._10_2_;
                auVar54._10_2_ =
                     (sVar40 < (short)uVar79) * uVar79 | (ushort)(sVar40 >= (short)uVar79) * sVar40;
                sVar40 = auVar68._12_2_;
                sVar39 = auVar68._14_2_;
                auVar54._12_2_ =
                     (sVar40 < (short)uVar80) * uVar80 | (ushort)(sVar40 >= (short)uVar80) * sVar40;
                auVar54._14_2_ =
                     (sVar39 < (short)uVar81) * uVar81 | (ushort)(sVar39 >= (short)uVar81) * sVar39;
                puVar1 = (ushort *)((long)*ptr + lVar29);
                *puVar1 = uVar73;
                puVar1[1] = uVar75;
                puVar1[2] = uVar76;
                puVar1[3] = uVar77;
                puVar1[4] = uVar78;
                puVar1[5] = uVar79;
                puVar1[6] = uVar80;
                puVar1[7] = uVar81;
                *(undefined1 (*) [16])((long)*ptr_01 + lVar29) = auVar54;
                lVar29 = lVar29 + 0x10;
                auVar55 = auVar69;
              }
              auVar74._8_8_ = auVar54._8_8_ << 0x10 | auVar54._0_8_ >> 0x30;
              uVar73 = ptr_00[uVar27 + 1];
              auVar74._0_8_ = auVar54._0_8_ << 0x10 | (ulong)uVar73;
              auVar69 = paddsw((undefined1  [16])*ptr_03,auVar74);
              sVar57 = auVar69._0_2_;
              auVar68._0_2_ =
                   (ushort)(sVar40 < sVar57) * sVar57 | (ushort)(sVar40 >= sVar57) * sVar40;
              sVar40 = auVar69._2_2_;
              auVar68._2_2_ =
                   (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
              sVar40 = auVar69._4_2_;
              auVar68._4_2_ =
                   (ushort)(sVar42 < sVar40) * sVar40 | (ushort)(sVar42 >= sVar40) * sVar42;
              sVar40 = auVar69._6_2_;
              auVar68._6_2_ =
                   (ushort)(sVar49 < sVar40) * sVar40 | (ushort)(sVar49 >= sVar40) * sVar49;
              sVar40 = auVar69._8_2_;
              auVar68._8_2_ =
                   (ushort)(sVar50 < sVar40) * sVar40 | (ushort)(sVar50 >= sVar40) * sVar50;
              sVar40 = auVar69._10_2_;
              auVar68._10_2_ =
                   (ushort)(sVar51 < sVar40) * sVar40 | (ushort)(sVar51 >= sVar40) * sVar51;
              sVar40 = auVar69._12_2_;
              auVar68._12_2_ =
                   (ushort)(sVar52 < sVar40) * sVar40 | (ushort)(sVar52 >= sVar40) * sVar52;
              sVar40 = auVar69._14_2_;
              auVar68._14_2_ =
                   (ushort)(sVar53 < sVar40) * sVar40 | (ushort)(sVar53 >= sVar40) * sVar53;
              iVar17 = 6;
              while( true ) {
                auVar70._0_8_ = auVar68._0_8_ << 0x10;
                auVar70._8_8_ = auVar68._8_8_ << 0x10 | auVar68._0_8_ >> 0x30;
                bVar31 = iVar17 == 0;
                iVar17 = iVar17 + -1;
                if (bVar31) break;
                auVar69 = paddsw(auVar70,auVar41);
                sVar40 = auVar69._0_2_;
                sVar39 = auVar68._0_2_;
                auVar59._0_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._2_2_;
                sVar39 = auVar68._2_2_;
                auVar59._2_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._4_2_;
                sVar39 = auVar68._4_2_;
                auVar59._4_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._6_2_;
                sVar39 = auVar68._6_2_;
                auVar59._6_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._8_2_;
                sVar39 = auVar68._8_2_;
                auVar59._8_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._10_2_;
                sVar39 = auVar68._10_2_;
                auVar59._10_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._12_2_;
                sVar39 = auVar68._12_2_;
                sVar42 = auVar68._14_2_;
                auVar59._12_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._14_2_;
                auVar59._14_2_ =
                     (ushort)(sVar42 < sVar40) * sVar40 | (ushort)(sVar42 >= sVar40) * sVar42;
                auVar68 = auVar59;
              }
              auVar71 = paddsw(auVar70,ZEXT416(local_d4 & 0xffff));
              sVar40 = auVar71._0_2_;
              auVar56._0_2_ =
                   (ushort)((short)uVar73 < sVar40) * sVar40 | ((short)uVar73 >= sVar40) * uVar73;
              sVar40 = auVar71._2_2_;
              sVar39 = auVar54._0_2_;
              auVar56._2_2_ =
                   (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
              sVar40 = auVar71._4_2_;
              sVar39 = auVar54._2_2_;
              auVar56._4_2_ =
                   (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
              sVar40 = auVar71._6_2_;
              sVar39 = auVar54._4_2_;
              auVar56._6_2_ =
                   (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
              sVar40 = auVar71._8_2_;
              sVar39 = auVar54._6_2_;
              auVar56._8_2_ =
                   (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
              sVar40 = auVar71._10_2_;
              sVar39 = auVar54._8_2_;
              auVar56._10_2_ =
                   (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
              sVar40 = auVar71._12_2_;
              sVar39 = auVar54._10_2_;
              sVar42 = auVar54._12_2_;
              auVar56._12_2_ =
                   (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
              sVar40 = auVar71._14_2_;
              auVar56._14_2_ =
                   (ushort)(sVar42 < sVar40) * sVar40 | (ushort)(sVar42 >= sVar40) * sVar42;
              for (lVar29 = 0; lVar24 != lVar29; lVar29 = lVar29 + 0x10) {
                auVar8._4_4_ = uVar33;
                auVar8._0_4_ = uVar33;
                auVar8._8_4_ = uVar33;
                auVar8._12_4_ = uVar33;
                auVar72 = psubsw(auVar71,auVar8);
                auVar69 = psubsw(auVar56,auVar46);
                sVar40 = auVar69._0_2_;
                sVar39 = auVar72._0_2_;
                auVar71._0_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._2_2_;
                sVar39 = auVar72._2_2_;
                auVar71._2_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._4_2_;
                sVar39 = auVar72._4_2_;
                auVar71._4_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._6_2_;
                sVar39 = auVar72._6_2_;
                auVar71._6_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._8_2_;
                sVar39 = auVar72._8_2_;
                auVar71._8_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._10_2_;
                sVar39 = auVar72._10_2_;
                auVar71._10_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._12_2_;
                sVar39 = auVar72._12_2_;
                sVar42 = auVar72._14_2_;
                auVar71._12_2_ =
                     (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar69._14_2_;
                auVar71._14_2_ =
                     (ushort)(sVar42 < sVar40) * sVar40 | (ushort)(sVar42 >= sVar40) * sVar42;
                psVar2 = (short *)((long)*ptr_01 + lVar29);
                sVar40 = *psVar2;
                sVar39 = psVar2[1];
                sVar42 = psVar2[2];
                sVar49 = psVar2[3];
                sVar50 = psVar2[4];
                sVar51 = psVar2[5];
                sVar52 = psVar2[6];
                sVar53 = psVar2[7];
                auVar56._0_2_ =
                     (sVar40 < (short)auVar71._0_2_) * auVar71._0_2_ |
                     (ushort)(sVar40 >= (short)auVar71._0_2_) * sVar40;
                auVar56._2_2_ =
                     (sVar39 < (short)auVar71._2_2_) * auVar71._2_2_ |
                     (ushort)(sVar39 >= (short)auVar71._2_2_) * sVar39;
                auVar56._4_2_ =
                     (sVar42 < (short)auVar71._4_2_) * auVar71._4_2_ |
                     (ushort)(sVar42 >= (short)auVar71._4_2_) * sVar42;
                auVar56._6_2_ =
                     (sVar49 < (short)auVar71._6_2_) * auVar71._6_2_ |
                     (ushort)(sVar49 >= (short)auVar71._6_2_) * sVar49;
                auVar56._8_2_ =
                     (sVar50 < (short)auVar71._8_2_) * auVar71._8_2_ |
                     (ushort)(sVar50 >= (short)auVar71._8_2_) * sVar50;
                auVar56._10_2_ =
                     (sVar51 < (short)auVar71._10_2_) * auVar71._10_2_ |
                     (ushort)(sVar51 >= (short)auVar71._10_2_) * sVar51;
                auVar56._12_2_ =
                     (sVar52 < (short)auVar71._12_2_) * auVar71._12_2_ |
                     (ushort)(sVar52 >= (short)auVar71._12_2_) * sVar52;
                auVar56._14_2_ =
                     (sVar53 < (short)auVar71._14_2_) * auVar71._14_2_ |
                     (ushort)(sVar53 >= (short)auVar71._14_2_) * sVar53;
                *(undefined1 (*) [16])((long)*ptr_02 + lVar29) = auVar56;
                sVar40 = auVar34._0_2_;
                uVar73 = ((short)auVar71._0_2_ < sVar40) * auVar71._0_2_ |
                         (ushort)((short)auVar71._0_2_ >= sVar40) * sVar40;
                sVar40 = auVar34._2_2_;
                uVar75 = ((short)auVar71._2_2_ < sVar40) * auVar71._2_2_ |
                         (ushort)((short)auVar71._2_2_ >= sVar40) * sVar40;
                sVar40 = auVar34._4_2_;
                uVar76 = ((short)auVar71._4_2_ < sVar40) * auVar71._4_2_ |
                         (ushort)((short)auVar71._4_2_ >= sVar40) * sVar40;
                sVar40 = auVar34._6_2_;
                uVar77 = ((short)auVar71._6_2_ < sVar40) * auVar71._6_2_ |
                         (ushort)((short)auVar71._6_2_ >= sVar40) * sVar40;
                sVar40 = auVar34._8_2_;
                uVar78 = ((short)auVar71._8_2_ < sVar40) * auVar71._8_2_ |
                         (ushort)((short)auVar71._8_2_ >= sVar40) * sVar40;
                sVar40 = auVar34._10_2_;
                uVar79 = ((short)auVar71._10_2_ < sVar40) * auVar71._10_2_ |
                         (ushort)((short)auVar71._10_2_ >= sVar40) * sVar40;
                sVar40 = auVar34._12_2_;
                sVar39 = auVar34._14_2_;
                uVar80 = ((short)auVar71._12_2_ < sVar40) * auVar71._12_2_ |
                         (ushort)((short)auVar71._12_2_ >= sVar40) * sVar40;
                uVar81 = ((short)auVar71._14_2_ < sVar39) * auVar71._14_2_ |
                         (ushort)((short)auVar71._14_2_ >= sVar39) * sVar39;
                auVar34._0_2_ =
                     ((short)auVar56._0_2_ < (short)uVar73) * auVar56._0_2_ |
                     ((short)auVar56._0_2_ >= (short)uVar73) * uVar73;
                auVar34._2_2_ =
                     ((short)auVar56._2_2_ < (short)uVar75) * auVar56._2_2_ |
                     ((short)auVar56._2_2_ >= (short)uVar75) * uVar75;
                auVar34._4_2_ =
                     ((short)auVar56._4_2_ < (short)uVar76) * auVar56._4_2_ |
                     ((short)auVar56._4_2_ >= (short)uVar76) * uVar76;
                auVar34._6_2_ =
                     ((short)auVar56._6_2_ < (short)uVar77) * auVar56._6_2_ |
                     ((short)auVar56._6_2_ >= (short)uVar77) * uVar77;
                auVar34._8_2_ =
                     ((short)auVar56._8_2_ < (short)uVar78) * auVar56._8_2_ |
                     ((short)auVar56._8_2_ >= (short)uVar78) * uVar78;
                auVar34._10_2_ =
                     ((short)auVar56._10_2_ < (short)uVar79) * auVar56._10_2_ |
                     ((short)auVar56._10_2_ >= (short)uVar79) * uVar79;
                auVar34._12_2_ =
                     ((short)auVar56._12_2_ < (short)uVar80) * auVar56._12_2_ |
                     ((short)auVar56._12_2_ >= (short)uVar80) * uVar80;
                auVar34._14_2_ =
                     ((short)auVar56._14_2_ < (short)uVar81) * auVar56._14_2_ |
                     ((short)auVar56._14_2_ >= (short)uVar81) * uVar81;
                sVar40 = auVar44._0_2_;
                auVar45._0_2_ =
                     (sVar40 < (short)auVar56._0_2_) * auVar56._0_2_ |
                     (ushort)(sVar40 >= (short)auVar56._0_2_) * sVar40;
                sVar40 = auVar44._2_2_;
                auVar45._2_2_ =
                     (sVar40 < (short)auVar56._2_2_) * auVar56._2_2_ |
                     (ushort)(sVar40 >= (short)auVar56._2_2_) * sVar40;
                sVar40 = auVar44._4_2_;
                auVar45._4_2_ =
                     (sVar40 < (short)auVar56._4_2_) * auVar56._4_2_ |
                     (ushort)(sVar40 >= (short)auVar56._4_2_) * sVar40;
                sVar40 = auVar44._6_2_;
                auVar45._6_2_ =
                     (sVar40 < (short)auVar56._6_2_) * auVar56._6_2_ |
                     (ushort)(sVar40 >= (short)auVar56._6_2_) * sVar40;
                sVar40 = auVar44._8_2_;
                auVar45._8_2_ =
                     (sVar40 < (short)auVar56._8_2_) * auVar56._8_2_ |
                     (ushort)(sVar40 >= (short)auVar56._8_2_) * sVar40;
                sVar40 = auVar44._10_2_;
                auVar45._10_2_ =
                     (sVar40 < (short)auVar56._10_2_) * auVar56._10_2_ |
                     (ushort)(sVar40 >= (short)auVar56._10_2_) * sVar40;
                sVar40 = auVar44._12_2_;
                sVar39 = auVar44._14_2_;
                auVar45._12_2_ =
                     (sVar40 < (short)auVar56._12_2_) * auVar56._12_2_ |
                     (ushort)(sVar40 >= (short)auVar56._12_2_) * sVar40;
                auVar45._14_2_ =
                     (sVar39 < (short)auVar56._14_2_) * auVar56._14_2_ |
                     (ushort)(sVar39 >= (short)auVar56._14_2_) * sVar39;
                auVar44 = auVar45;
              }
              alVar43 = ptr_02[(ulong)uVar12 % uVar28];
              sVar40 = auVar48._0_2_;
              sVar57 = (short)alVar43[0];
              auVar60._0_2_ = -(ushort)(sVar40 < sVar57);
              sVar39 = auVar48._2_2_;
              sVar61 = alVar43[0]._2_2_;
              auVar60._2_2_ = -(ushort)(sVar39 < sVar61);
              sVar42 = auVar48._4_2_;
              sVar62 = alVar43[0]._4_2_;
              auVar60._4_2_ = -(ushort)(sVar42 < sVar62);
              sVar49 = auVar48._6_2_;
              sVar63 = alVar43[0]._6_2_;
              auVar60._6_2_ = -(ushort)(sVar49 < sVar63);
              sVar50 = auVar48._8_2_;
              sVar64 = (short)alVar43[1];
              auVar60._8_2_ = -(ushort)(sVar50 < sVar64);
              sVar51 = auVar48._10_2_;
              sVar65 = alVar43[1]._2_2_;
              auVar60._10_2_ = -(ushort)(sVar51 < sVar65);
              sVar52 = auVar48._12_2_;
              sVar66 = alVar43[1]._4_2_;
              sVar67 = alVar43[1]._6_2_;
              auVar60._12_2_ = -(ushort)(sVar52 < sVar66);
              sVar53 = auVar48._14_2_;
              auVar60._14_2_ = -(ushort)(sVar53 < sVar67);
              auVar9._2_2_ = -(ushort)(sVar37 == 6);
              auVar9._0_2_ = -(ushort)(sVar32 == 7);
              auVar9._4_2_ = -(ushort)(sVar32 == 5);
              auVar9._6_2_ = -(ushort)(sVar37 == 4);
              auVar9._8_2_ = -(ushort)(sVar32 == 3);
              auVar9._10_2_ = -(ushort)(sVar37 == 2);
              auVar9._12_2_ = -(ushort)(sVar32 == 1);
              auVar9._14_2_ = -(ushort)(sVar37 == 0);
              auVar60 = auVar60 & auVar9;
              iVar17 = 0;
              while( true ) {
                uVar58 = alVar43[0];
                lVar29 = alVar43[1];
                if ((int)uVar20 <= iVar17) break;
                alVar43[0] = uVar58 << 0x10;
                alVar43[1] = lVar29 << 0x10 | uVar58 >> 0x30;
                iVar17 = iVar17 + 1;
              }
              if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar60 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar60 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar60 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar60 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar60 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar60 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar60 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar60 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar60 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                local_d0 = (int)uVar27;
              }
              auVar48._0_2_ =
                   (ushort)(sVar40 < sVar57) * sVar57 | (ushort)(sVar40 >= sVar57) * sVar40;
              auVar48._2_2_ =
                   (ushort)(sVar39 < sVar61) * sVar61 | (ushort)(sVar39 >= sVar61) * sVar39;
              auVar48._4_2_ =
                   (ushort)(sVar42 < sVar62) * sVar62 | (ushort)(sVar42 >= sVar62) * sVar42;
              auVar48._6_2_ =
                   (ushort)(sVar49 < sVar63) * sVar63 | (ushort)(sVar49 >= sVar63) * sVar49;
              auVar48._8_2_ =
                   (ushort)(sVar50 < sVar64) * sVar64 | (ushort)(sVar50 >= sVar64) * sVar50;
              auVar48._10_2_ =
                   (ushort)(sVar51 < sVar65) * sVar65 | (ushort)(sVar51 >= sVar65) * sVar51;
              auVar48._12_2_ =
                   (ushort)(sVar52 < sVar66) * sVar66 | (ushort)(sVar52 >= sVar66) * sVar52;
              auVar48._14_2_ =
                   (ushort)(sVar53 < sVar67) * sVar67 | (ushort)(sVar53 >= sVar67) * sVar53;
              ((ppVar13->field_4).rowcols)->score_row[uVar27] = (int)alVar43[1]._6_2_;
              uVar27 = uVar27 + 1;
            }
            for (uVar27 = 0; uVar16 * 4 != uVar27; uVar27 = uVar27 + 4) {
              psVar2 = (short *)((long)*ptr_02 + uVar27 * 4);
              sVar32 = psVar2[1];
              sVar37 = psVar2[2];
              sVar40 = psVar2[3];
              sVar39 = psVar2[4];
              sVar42 = psVar2[5];
              sVar49 = psVar2[6];
              sVar50 = psVar2[7];
              piVar6 = ((ppVar13->field_4).rowcols)->score_col;
              *(int *)((long)piVar6 + uVar27) = (int)*psVar2;
              *(int *)((long)piVar6 + uVar16 * 4 + uVar27) = (int)sVar32;
              *(int *)((long)piVar6 + uVar28 * 8 + uVar27) = (int)sVar37;
              *(int *)((long)piVar6 + uVar28 * 0xc + uVar27) = (int)sVar40;
              *(int *)((long)piVar6 + lVar24 + uVar27) = (int)sVar39;
              *(int *)((long)piVar6 + uVar28 * 0x14 + uVar27) = (int)sVar42;
              *(int *)((long)piVar6 + uVar28 * 0x18 + uVar27) = (int)sVar49;
              *(int *)((long)piVar6 + uVar28 * 0x1c + uVar27) = (int)sVar50;
            }
            if (s2_end != 0) {
              iVar17 = 0;
              while( true ) {
                uVar27 = auVar48._0_8_;
                lVar24 = auVar48._8_8_;
                if ((int)uVar20 <= iVar17) break;
                auVar48._0_8_ = uVar27 << 0x10;
                auVar48._8_8_ = lVar24 << 0x10 | uVar27 >> 0x30;
                iVar17 = iVar17 + 1;
              }
              local_d4 = (uint)auVar48._14_2_;
            }
            uVar22 = uVar12;
            if (s1_end != 0) {
              uVar27 = 0;
              while( true ) {
                if ((uVar16 & 0xfffffff) << 3 == (uint)uVar27) break;
                uVar18 = ((uint)uVar27 & 7) * uVar16 + ((uint)(uVar27 >> 3) & 0x1fffffff);
                uVar10 = uVar22;
                uVar11 = local_d4;
                iVar17 = local_d0;
                if ((int)uVar18 < (int)uVar3) {
                  uVar73 = *(ushort *)((long)*ptr_02 + uVar27 * 2);
                  uVar10 = uVar18;
                  uVar11 = (uint)uVar73;
                  iVar17 = iVar15;
                  if ((short)uVar73 <= (short)(ushort)local_d4) {
                    if ((int)uVar22 <= (int)uVar18) {
                      uVar18 = uVar22;
                    }
                    if (local_d0 != iVar15) {
                      uVar18 = uVar22;
                    }
                    uVar10 = uVar22;
                    uVar11 = local_d4;
                    iVar17 = local_d0;
                    if (uVar73 == (ushort)local_d4) {
                      uVar10 = uVar18;
                    }
                  }
                }
                local_d0 = iVar17;
                local_d4 = uVar11;
                uVar22 = uVar10;
                uVar27 = uVar27 + 1;
              }
            }
            if (s2_end == 0 && s1_end == 0) {
              alVar47 = ptr_02[(ulong)uVar12 % uVar28];
              iVar17 = 0;
              while( true ) {
                uVar28 = alVar47[0];
                lVar24 = alVar47[1];
                if ((int)uVar20 <= iVar17) break;
                alVar47[0] = uVar28 << 0x10;
                alVar47[1] = lVar24 << 0x10 | uVar28 >> 0x30;
                iVar17 = iVar17 + 1;
              }
              local_d4._0_2_ = alVar47[1]._6_2_;
              uVar22 = uVar12;
              local_d0 = iVar15;
            }
            sVar32 = auVar35._0_2_;
            auVar41._0_2_ = -(ushort)(auVar34._0_2_ < sVar32);
            sVar37 = auVar35._2_2_;
            auVar41._2_2_ = -(ushort)(auVar34._2_2_ < sVar37);
            auVar41._4_2_ = -(ushort)(auVar34._4_2_ < sVar32);
            auVar41._6_2_ = -(ushort)(auVar34._6_2_ < sVar37);
            auVar41._8_2_ = -(ushort)(auVar34._8_2_ < sVar32);
            auVar41._10_2_ = -(ushort)(auVar34._10_2_ < sVar37);
            auVar41._12_2_ = -(ushort)(auVar34._12_2_ < sVar32);
            auVar41._14_2_ = -(ushort)(auVar34._14_2_ < sVar37);
            sVar32 = auVar38._0_2_;
            auVar35._0_2_ = -(ushort)(sVar32 < auVar44._0_2_);
            sVar37 = auVar38._2_2_;
            auVar35._2_2_ = -(ushort)(sVar37 < auVar44._2_2_);
            auVar35._4_2_ = -(ushort)(sVar32 < auVar44._4_2_);
            auVar35._6_2_ = -(ushort)(sVar37 < auVar44._6_2_);
            auVar35._8_2_ = -(ushort)(sVar32 < auVar44._8_2_);
            auVar35._10_2_ = -(ushort)(sVar37 < auVar44._10_2_);
            auVar35._12_2_ = -(ushort)(sVar32 < auVar44._12_2_);
            auVar35._14_2_ = -(ushort)(sVar37 < auVar44._14_2_);
            auVar35 = auVar35 | auVar41;
            if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar35 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar35 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar35 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar35 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar35 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar35 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar35 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar35 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar35 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar35 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar35[0xf] < '\0') {
              *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
              local_d4._0_2_ = 0;
              local_d0 = 0;
              uVar22 = 0;
            }
            ppVar13->score = (int)(short)(ushort)local_d4;
            ppVar13->end_query = uVar22;
            ppVar13->end_ref = local_d0;
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar13;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_rowcol_scan_profile_sse41_128_16",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}